

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

uint32_t readUINT32(ifstream *stream)

{
  undefined8 in_RAX;
  uint32_t value;
  
  value = (uint32_t)((ulong)in_RAX >> 0x20);
  std::istream::read((char *)stream,(long)&value);
  std::__reverse<char*>(&value,&stack0xfffffffffffffff0);
  return value;
}

Assistant:

uint32_t readUINT32(std::ifstream& stream)
{
    uint32_t value;
    char * buff = reinterpret_cast<char *>(&value);
    stream.read(buff, 4);
    std::reverse(buff, buff + 4);
    return value;
}